

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qzip.cpp
# Opt level: O1

void __thiscall QZipReader::QZipReader(QZipReader *this,QString *archive,OpenMode mode)

{
  int iVar1;
  FileError FVar2;
  QFile *this_00;
  QZipReaderPrivate *pQVar3;
  undefined4 uVar4;
  
  this_00 = (QFile *)operator_new(0x10);
  QFile::QFile(this_00,archive);
  iVar1 = (*(this_00->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xd])
                    (this_00,(ulong)(uint)mode.
                                          super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                                          super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  FVar2 = QFileDevice::error((QFileDevice *)this_00);
  uVar4 = 0;
  if (((byte)iVar1 & FVar2 == NoError) == 0) {
    if (FVar2 == ReadError) {
      uVar4 = 1;
    }
    else if (FVar2 == PermissionsError) {
      uVar4 = 3;
    }
    else if (FVar2 == OpenError) {
      uVar4 = 2;
    }
    else {
      uVar4 = 4;
    }
  }
  pQVar3 = (QZipReaderPrivate *)operator_new(0x48);
  (pQVar3->super_QZipPrivate).device = (QIODevice *)this_00;
  (pQVar3->super_QZipPrivate).ownDevice = true;
  (pQVar3->super_QZipPrivate).dirtyFileTree = true;
  (pQVar3->super_QZipPrivate).fileHeaders.d.d = (Data *)0x0;
  (pQVar3->super_QZipPrivate).fileHeaders.d.ptr = (FileHeader *)0x0;
  (pQVar3->super_QZipPrivate).fileHeaders.d.size = 0;
  (pQVar3->super_QZipPrivate).comment.d.d = (Data *)0x0;
  (pQVar3->super_QZipPrivate).comment.d.ptr = (char *)0x0;
  (pQVar3->super_QZipPrivate).comment.d.size = 0;
  *(undefined8 *)&(pQVar3->super_QZipPrivate).start_of_directory = 0;
  this->d = pQVar3;
  *(undefined4 *)&(pQVar3->super_QZipPrivate).field_0x44 = uVar4;
  return;
}

Assistant:

QZipReader::QZipReader(const QString &archive, QIODevice::OpenMode mode)
{
    auto f = std::make_unique<QFile>(archive);
    const bool result = f->open(mode);
    QZipReader::Status status;
    const QFileDevice::FileError error = f->error();
    if (result && error == QFile::NoError) {
        status = NoError;
    } else {
        if (error == QFile::ReadError)
            status = FileReadError;
        else if (error == QFile::OpenError)
            status = FileOpenError;
        else if (error == QFile::PermissionsError)
            status = FilePermissionsError;
        else
            status = FileError;
    }

    d = new QZipReaderPrivate(f.get(), /*ownDevice=*/true);
    Q_UNUSED(f.release());
    d->status = status;
}